

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_box.cpp
# Opt level: O0

void Omega_h::make_3d_box(Real x,Real y,Real z,LO nx,LO ny,LO nz,LOs *hv2v_out,Reals *coords_out)

{
  int n;
  int iVar1;
  int iVar2;
  int n_00;
  Write<double> local_188;
  Read<double> local_178;
  Write<int> local_168;
  Read<int> local_158;
  undefined1 local_148 [8];
  type fill_conn;
  string local_120 [32];
  undefined1 local_100 [8];
  Write<int> hv2v;
  type fill_coords;
  allocator local_a9;
  string local_a8 [32];
  undefined1 local_88 [8];
  Write<double> coords;
  Real dz;
  Real dy;
  Real dx;
  LO nv;
  LO nvxy;
  LO nvz;
  LO nvy;
  LO nvx;
  LO nh;
  LO nxy;
  Reals *coords_out_local;
  LOs *hv2v_out_local;
  LO nz_local;
  LO ny_local;
  LO nx_local;
  Real z_local;
  Real y_local;
  Real x_local;
  
  n = nx * ny * nz;
  iVar1 = nx + 1;
  iVar2 = iVar1 * (ny + 1);
  n_00 = iVar1 * (ny + 1) * (nz + 1);
  coords.shared_alloc_.direct_ptr = (void *)(z / (double)nz);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,"",&local_a9);
  Write<double>::Write((Write<double> *)local_88,n_00 * 3,(string *)local_a8);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  hv2v.shared_alloc_.direct_ptr._0_4_ = iVar2;
  hv2v.shared_alloc_.direct_ptr._4_4_ = iVar1;
  Write<double>::Write((Write<double> *)&fill_coords,(Write<double> *)local_88);
  fill_coords.dy = (Real)coords.shared_alloc_.direct_ptr;
  fill_coords.coords.shared_alloc_.direct_ptr = (void *)(x / (double)nx);
  fill_coords.dx = y / (double)ny;
  parallel_for<Omega_h::make_3d_box(double,double,double,int,int,int,Omega_h::Read<int>*,Omega_h::Read<double>*)::__0>
            (n_00,(type *)&hv2v.shared_alloc_.direct_ptr,"make_3d_box(coords)");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_120,"",(allocator *)((long)&fill_conn.nvx + 3));
  Write<int>::Write((Write<int> *)local_100,n * 8,(string *)local_120);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator((allocator<char> *)((long)&fill_conn.nvx + 3));
  local_148._0_4_ = nx * ny;
  local_148._4_4_ = nx;
  Write<int>::Write((Write<int> *)&fill_conn,(Write<int> *)local_100);
  fill_conn.hv2v.shared_alloc_.direct_ptr._0_4_ = iVar2;
  fill_conn.hv2v.shared_alloc_.direct_ptr._4_4_ = iVar1;
  parallel_for<Omega_h::make_3d_box(double,double,double,int,int,int,Omega_h::Read<int>*,Omega_h::Read<double>*)::__1>
            (n,(type *)local_148,"make_3d_box(conn)");
  Write<int>::Write(&local_168,(Write<int> *)local_100);
  Read<int>::Read(&local_158,&local_168);
  Read<int>::operator=(hv2v_out,&local_158);
  Read<int>::~Read(&local_158);
  Write<int>::~Write(&local_168);
  Write<double>::Write(&local_188,(Write<double> *)local_88);
  Read<double>::Read(&local_178,&local_188);
  Read<double>::operator=(coords_out,&local_178);
  Read<double>::~Read(&local_178);
  Write<double>::~Write(&local_188);
  make_3d_box(double,double,double,int,int,int,Omega_h::Read<int>*,Omega_h::Read<double>*)::$_1::
  ~__1((__1 *)local_148);
  Write<int>::~Write((Write<int> *)local_100);
  make_3d_box(double,double,double,int,int,int,Omega_h::Read<int>*,Omega_h::Read<double>*)::$_0::
  ~__0((__0 *)&hv2v.shared_alloc_.direct_ptr);
  Write<double>::~Write((Write<double> *)local_88);
  return;
}

Assistant:

void make_3d_box(Real x, Real y, Real z, LO nx, LO ny, LO nz, LOs* hv2v_out,
    Reals* coords_out) {
  LO nxy = nx * ny;
  LO nh = nx * ny * nz;
  LO nvx = nx + 1;
  LO nvy = ny + 1;
  LO nvz = nz + 1;
  LO nvxy = nvx * nvy;
  LO nv = nvx * nvy * nvz;
  Real dx = x / nx;
  Real dy = y / ny;
  Real dz = z / nz;
  Write<Real> coords(nv * 3);
  auto fill_coords = OMEGA_H_LAMBDA(LO v) {
    LO ij = v % nvxy;
    LO k = v / nvxy;
    LO i = ij % nvx;
    LO j = ij / nvx;
    coords[v * 3 + 0] = i * dx;
    coords[v * 3 + 1] = j * dy;
    coords[v * 3 + 2] = k * dz;
  };
  parallel_for(nv, fill_coords, "make_3d_box(coords)");
  Write<LO> hv2v(nh * 8);
  auto fill_conn = OMEGA_H_LAMBDA(LO h) {
    LO ij = h % nxy;
    LO k = h / nxy;
    LO i = ij % nx;
    LO j = ij / nx;
    hv2v[h * 8 + 0] = (k + 0) * nvxy + (j + 0) * nvx + (i + 0);
    hv2v[h * 8 + 1] = (k + 0) * nvxy + (j + 0) * nvx + (i + 1);
    hv2v[h * 8 + 2] = (k + 0) * nvxy + (j + 1) * nvx + (i + 1);
    hv2v[h * 8 + 3] = (k + 0) * nvxy + (j + 1) * nvx + (i + 0);
    hv2v[h * 8 + 4] = (k + 1) * nvxy + (j + 0) * nvx + (i + 0);
    hv2v[h * 8 + 5] = (k + 1) * nvxy + (j + 0) * nvx + (i + 1);
    hv2v[h * 8 + 6] = (k + 1) * nvxy + (j + 1) * nvx + (i + 1);
    hv2v[h * 8 + 7] = (k + 1) * nvxy + (j + 1) * nvx + (i + 0);
  };
  parallel_for(nh, fill_conn, "make_3d_box(conn)");
  *hv2v_out = hv2v;
  *coords_out = coords;
}